

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_CheckIndex_Test::ExprTest_CheckIndex_Test(ExprTest_CheckIndex_Test *this)

{
  ExprTest::ExprTest(&this->super_ExprTest);
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_0018ec48;
  return;
}

Assistant:

TEST_F(ExprTest, CheckIndex) {
  mp::internal::CheckIndex(0, 3);
  mp::internal::CheckIndex(2, 3);
  EXPECT_ASSERT(mp::internal::CheckIndex(-10, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(-1, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(3, 3), "invalid index");
  EXPECT_ASSERT(mp::internal::CheckIndex(10, 3), "invalid index");
}